

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPU4StateImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  int iVar20;
  double *pdVar21;
  double *pdVar22;
  int *piVar23;
  double *pdVar24;
  double *pdVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  double *pdVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  
  pdVar36 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[parIndex];
  pdVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).gTransitionMatrices[probIndex];
  pdVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  memset((this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp,0,
         (long)(this->super_BeagleCPUImpl<double,_1,_0>).kStateCount *
         (long)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount * 8);
  if ((childIndex < (this->super_BeagleCPUImpl<double,_1,_0>).kTipCount) &&
     (piVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).gTipStates[childIndex],
     piVar23 != (int *)0x0)) {
    lVar26 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    if (0 < lVar26) {
      uVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
      iVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
      pdVar24 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      lVar32 = 0;
      iVar33 = 0;
      iVar34 = 0;
      do {
        if (0 < (int)uVar19) {
          auVar43._8_8_ = 0;
          auVar43._0_8_ = pdVar22[lVar32];
          lVar35 = 0;
          do {
            iVar27 = *(int *)((long)piVar23 + lVar35);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = pdVar24[lVar35];
            auVar47._8_8_ = 0;
            auVar47._0_8_ = pdVar21[iVar27 + iVar34] * pdVar36[iVar33 + lVar35];
            auVar44 = vfmadd213sd_fma(auVar47,auVar43,auVar8);
            pdVar24[lVar35] = auVar44._0_8_;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = pdVar24[lVar35 + 1];
            auVar48._8_8_ = 0;
            auVar48._0_8_ = pdVar21[iVar34 + 5 + iVar27] * pdVar36[(long)iVar33 + lVar35 + 1];
            auVar44 = vfmadd213sd_fma(auVar48,auVar43,auVar9);
            pdVar24[lVar35 + 1] = auVar44._0_8_;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = pdVar24[lVar35 + 2];
            auVar49._8_8_ = 0;
            auVar49._0_8_ = pdVar21[iVar34 + 10 + iVar27] * pdVar36[(long)iVar33 + lVar35 + 2];
            auVar44 = vfmadd213sd_fma(auVar49,auVar43,auVar10);
            pdVar24[lVar35 + 2] = auVar44._0_8_;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = pdVar24[lVar35 + 3];
            auVar50._8_8_ = 0;
            auVar50._0_8_ = pdVar21[iVar27 + iVar34 + 0xf] * pdVar36[(long)iVar33 + lVar35 + 3];
            auVar44 = vfmadd213sd_fma(auVar50,auVar43,auVar11);
            pdVar24[lVar35 + 3] = auVar44._0_8_;
            lVar35 = lVar35 + 4;
          } while ((ulong)uVar19 << 2 != lVar35);
          iVar33 = iVar33 + (int)lVar35;
        }
        iVar33 = iVar33 + iVar20 * 4;
        iVar34 = iVar34 + 0x14;
        lVar32 = lVar32 + 1;
      } while (lVar32 != lVar26);
    }
  }
  else {
    lVar26 = (long)(this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    if (0 < lVar26) {
      pdVar24 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials[childIndex];
      iVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
      iVar33 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
      pdVar25 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      lVar32 = 0;
      lVar35 = 0;
      iVar34 = 0;
      do {
        if (0 < iVar20) {
          lVar28 = (long)iVar34;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = pdVar22[lVar32];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = pdVar21[lVar35];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = pdVar21[lVar35 + 1];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = pdVar21[lVar35 + 2];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = pdVar21[lVar35 + 3];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = pdVar21[lVar35 + 5];
          auVar60._8_8_ = 0;
          auVar60._0_8_ = pdVar21[lVar35 + 6];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = pdVar21[lVar35 + 7];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = pdVar21[lVar35 + 8];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = pdVar21[lVar35 + 10];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = pdVar21[lVar35 + 0xb];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = pdVar21[lVar35 + 0xc];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = pdVar21[lVar35 + 0xd];
          auVar67._8_8_ = 0;
          auVar67._0_8_ = pdVar21[lVar35 + 0xf];
          auVar68._8_8_ = 0;
          auVar68._0_8_ = pdVar21[lVar35 + 0x10];
          auVar69._8_8_ = 0;
          auVar69._0_8_ = pdVar21[lVar35 + 0x11];
          dVar4 = pdVar21[lVar35 + 0x12];
          lVar30 = 0x18;
          iVar27 = iVar20;
          do {
            uVar29 = *(ulong *)((long)pdVar24 + lVar30 + lVar28 * 8 + -0x18);
            uVar31 = *(ulong *)((long)pdVar24 + lVar30 + lVar28 * 8 + -0x10);
            uVar2 = *(ulong *)((long)pdVar24 + lVar30 + lVar28 * 8 + -8);
            uVar3 = *(ulong *)((long)pdVar24 + lVar30 + lVar28 * 8);
            auVar73._8_8_ = 0;
            auVar73._0_8_ = uVar31;
            auVar37 = vmulsd_avx512f(auVar56,auVar73);
            auVar71._8_8_ = 0;
            auVar71._0_8_ = uVar29;
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar51,auVar71);
            auVar75._8_8_ = 0;
            auVar75._0_8_ = uVar2;
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar57,auVar75);
            auVar77._8_8_ = 0;
            auVar77._0_8_ = uVar3;
            auVar38 = vfmadd231sd_avx512f(auVar37,auVar58,auVar77);
            auVar37 = vmulsd_avx512f(auVar60,auVar73);
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar59,auVar71);
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar61,auVar75);
            auVar39 = vfmadd231sd_avx512f(auVar37,auVar62,auVar77);
            auVar74._8_8_ = 0;
            auVar74._0_8_ = uVar31;
            auVar37 = vmulsd_avx512f(auVar64,auVar74);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar29;
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar63,auVar72);
            auVar76._8_8_ = 0;
            auVar76._0_8_ = uVar2;
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar65,auVar76);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = uVar3;
            auVar40 = vfmadd231sd_avx512f(auVar37,auVar66,auVar78);
            auVar37 = vmulsd_avx512f(auVar68,auVar74);
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar67,auVar72);
            auVar37 = vfmadd231sd_avx512f(auVar37,auVar69,auVar76);
            auVar70._8_8_ = 0;
            auVar70._0_8_ = dVar4;
            auVar41 = vfmadd231sd_avx512f(auVar37,auVar70,auVar78);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)((long)pdVar36 + lVar30 + lVar28 * 8 + -0x18);
            auVar37 = vmulsd_avx512f(auVar38,auVar37);
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *(ulong *)((long)pdVar25 + lVar30 + -0x18);
            auVar37 = vfmadd213sd_avx512f(auVar37,auVar44,auVar38);
            puVar1 = (undefined8 *)((long)pdVar25 + lVar30 + -0x18);
            vmovsd_avx512f(auVar37);
            *puVar1 = *puVar1;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)((long)pdVar36 + lVar30 + lVar28 * 8 + -0x10);
            auVar37 = vmulsd_avx512f(auVar39,auVar12);
            auVar39._8_8_ = 0;
            auVar39._0_8_ = *(ulong *)((long)pdVar25 + lVar30 + -0x10);
            auVar37 = vfmadd213sd_avx512f(auVar37,auVar44,auVar39);
            puVar1 = (undefined8 *)((long)pdVar25 + lVar30 + -0x10);
            vmovsd_avx512f(auVar37);
            *puVar1 = *puVar1;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = *(ulong *)((long)pdVar36 + lVar30 + lVar28 * 8 + -8);
            auVar37 = vmulsd_avx512f(auVar40,auVar13);
            auVar40._8_8_ = 0;
            auVar40._0_8_ = *(ulong *)((long)pdVar25 + lVar30 + -8);
            auVar37 = vfmadd213sd_avx512f(auVar37,auVar44,auVar40);
            puVar1 = (undefined8 *)((long)pdVar25 + lVar30 + -8);
            vmovsd_avx512f(auVar37);
            *puVar1 = *puVar1;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *(ulong *)((long)pdVar36 + lVar30 + lVar28 * 8);
            auVar37 = vmulsd_avx512f(auVar41,auVar14);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(ulong *)((long)pdVar25 + lVar30);
            auVar37 = vfmadd213sd_avx512f(auVar37,auVar44,auVar41);
            vmovsd_avx512f(auVar37);
            *(undefined8 *)((long)pdVar25 + lVar30) = *(undefined8 *)((long)pdVar25 + lVar30);
            lVar30 = lVar30 + 0x20;
            iVar27 = iVar27 + -1;
          } while (iVar27 != 0);
        }
        lVar35 = lVar35 + 0x14;
        lVar32 = lVar32 + 1;
        iVar34 = iVar34 + iVar33 * 4;
      } while (lVar32 != lVar26);
    }
  }
  uVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
  uVar29 = (ulong)uVar19;
  if (0 < (int)uVar19) {
    pdVar36 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies[stateFrequenciesIndex];
    dVar4 = *pdVar36;
    dVar5 = pdVar36[1];
    dVar6 = pdVar36[2];
    dVar7 = pdVar36[3];
    pdVar36 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp + 3;
    lVar26 = 0;
    do {
      auVar52._8_8_ = 0;
      auVar52._0_8_ = dVar4;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = pdVar36[-3];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar5 * pdVar36[-2];
      auVar44 = vfmadd231sd_fma(auVar45,auVar52,auVar15);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar6;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = pdVar36[-1];
      auVar44 = vfmadd231sd_fma(auVar44,auVar53,auVar16);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar7;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *pdVar36;
      auVar44 = vfmadd231sd_fma(auVar44,auVar54,auVar17);
      dVar42 = log(auVar44._0_8_);
      (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp[lVar26] = dVar42;
      lVar26 = lVar26 + 1;
      uVar29 = (ulong)(this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
      pdVar36 = pdVar36 + 4;
    } while (lVar26 < (long)uVar29);
  }
  if ((scalingFactorsIndex != -1) && (0 < (int)uVar29)) {
    pdVar36 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers[scalingFactorsIndex];
    pdVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
    uVar31 = 0;
    do {
      pdVar21[uVar31] = pdVar36[uVar31] + pdVar21[uVar31];
      uVar31 = uVar31 + 1;
    } while ((uVar29 & 0xffffffff) != uVar31);
  }
  *outSumLogLikelihood = 0.0;
  if (0 < (int)uVar29) {
    pdVar36 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
    pdVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
    auVar46 = ZEXT864(0) << 0x40;
    uVar31 = 0;
    do {
      auVar55._8_8_ = 0;
      auVar55._0_8_ = pdVar21[uVar31];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = pdVar36[uVar31];
      auVar44 = vfmadd231sd_fma(auVar46._0_16_,auVar55,auVar18);
      auVar46 = ZEXT1664(auVar44);
      *outSumLogLikelihood = auVar44._0_8_;
      uVar31 = uVar31 + 1;
    } while ((uVar29 & 0xffffffff) != uVar31);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                           const int childIndex,
                                                           const int probIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                           const int scalingFactorsIndex,
                                                           double* outSumLogLikelihood) {
    // TODO: implement derivatives for calculateEdgeLnL

    assert(parIndex >= kTipCount);

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];

                integrationTmp[u    ] += transMatrix[w            + stateChild] * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += transMatrix[w + OFFSET*1 + stateChild] * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += transMatrix[w + OFFSET*2 + stateChild] * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += transMatrix[w + OFFSET*3 + stateChild] * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
		#if 0//
        int v = 0;
		#endif
        int w = 0;
        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
			#if 1//
			int v = l*kPaddedPatternCount*4;
			#endif
            const REALTYPE weight = wt[l];

            PREFETCH_MATRIX(1,transMatrix,w);

            for(int k = 0; k < kPatternCount; k++) {

                const REALTYPE* partials1 = partialsChild;

                PREFETCH_PARTIALS(1,partials1,v);

                DO_INTEGRATION(1);

                integrationTmp[u    ] += sum10 * partialsParent[v    ] * weight;
                integrationTmp[u + 1] += sum11 * partialsParent[v + 1] * weight;
                integrationTmp[u + 2] += sum12 * partialsParent[v + 2] * weight;
                integrationTmp[u + 3] += sum13 * partialsParent[v + 3] * weight;

                u += 4;
                v += 4;
            }
            w += OFFSET*4;
			#if 0//
            if (kExtraPatterns)
            	v += 4 * kExtraPatterns;
			#endif//
        }
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}